

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void CorUnix::CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll
               (CPalThread *pthrCurrent,CPalThread *pthrTarget,WaitingThreadsListNode *pwtlnNode,
               CSynchData *psdTgtObjectSynchData)

{
  _ThreadWaitInfo *p_Var1;
  PWaitingThreadsListNode p_Var2;
  bool bVar3;
  PAL_ERROR PVar4;
  CSynchData *this;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((pwtlnNode->dwFlags & 2) == 0) {
    fprintf(_stderr,"] %s %s:%d","UnsignalRestOfLocalAwakeningWaitAll",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xab6);
    fprintf(_stderr,
            "Expression: 0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags), Description: UnsignalRestOfLocalAwakeningWaitAll() called on a normal (non wait all) wait"
           );
  }
  if (gPID != pwtlnNode->dwProcessId) {
    fprintf(_stderr,"] %s %s:%d","UnsignalRestOfLocalAwakeningWaitAll",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xaba);
    fprintf(_stderr,
            "Expression: gPID == pwtlnNode->dwProcessId, Description: UnsignalRestOfLocalAwakeningWaitAll() called on a wait all with remote awakening"
           );
  }
  p_Var1 = pwtlnNode->ptwiWaitInfo;
  lVar5 = (long)p_Var1->lObjCount;
  if (0 < lVar5) {
    bVar3 = false;
    lVar7 = 0;
    do {
      while( true ) {
        lVar6 = lVar7 + 1;
        p_Var2 = p_Var1->rgpWTLNodes[lVar7];
        if ((p_Var2->dwFlags & 1) == 0) {
          this = (p_Var2->ptrOwnerObjSynchData).ptr;
        }
        else {
          this = (CSynchData *)SHMPtrToPtr((p_Var2->ptrOwnerObjSynchData).shrid);
        }
        lVar7 = lVar6;
        if (this != psdTgtObjectSynchData) break;
        bVar3 = true;
        if (lVar6 == lVar5) {
          return;
        }
      }
      PVar4 = CSynchData::ReleaseWaiterWithoutBlocking(this,pthrCurrent,pthrTarget);
      if ((PVar4 != 0) && (PAL_InitializeChakraCoreCalled == false)) {
        abort();
      }
    } while (lVar6 != lVar5);
    if (bVar3) {
      return;
    }
  }
  fprintf(_stderr,"] %s %s:%d","UnsignalRestOfLocalAwakeningWaitAll",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
          ,0xae7);
  fprintf(_stderr,
          "Expression: bOriginatingNodeFound, Description: Couldn\'t find originating node while unsignaling rest of the wait all\n"
         );
  return;
}

Assistant:

void CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        WaitingThreadsListNode * pwtlnNode,
        CSynchData * psdTgtObjectSynchData)
    {
        int iObjCount = 0;
        int i;
        PAL_ERROR palErr = NO_ERROR;
        CSynchData * psdSynchDataItem = NULL;
        ThreadWaitInfo * ptwiWaitInfo = NULL;

#ifdef _DEBUG
        bool bOriginatingNodeFound = false;
#endif

        VALIDATEOBJECT(psdTgtObjectSynchData);
        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags),
                    "UnsignalRestOfLocalAwakeningWaitAll() called on a normal "
                    "(non wait all) wait");

        _ASSERT_MSG(gPID == pwtlnNode->dwProcessId,
                    "UnsignalRestOfLocalAwakeningWaitAll() called on a wait all "
                    "with remote awakening");

        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        iObjCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iObjCount; i++)
        {
            WaitingThreadsListNode * pwtlnItem = ptwiWaitInfo->rgpWTLNodes[i];

            VALIDATEOBJECT(pwtlnItem);

            if (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnItem->dwFlags))
            {
                psdSynchDataItem = SharedIDToTypePointer(CSynchData,
                    pwtlnItem->ptrOwnerObjSynchData.shrid);
            }
            else
            {
                psdSynchDataItem = pwtlnItem->ptrOwnerObjSynchData.ptr;
            }

            VALIDATEOBJECT(psdSynchDataItem);

            // Skip originating node
            if (psdTgtObjectSynchData == psdSynchDataItem)
            {
#ifdef _DEBUG
                bOriginatingNodeFound = true;
#endif
                continue;
            }

            palErr = psdSynchDataItem->ReleaseWaiterWithoutBlocking(
                pthrCurrent,
                pthrTarget);

            if (NO_ERROR != palErr)
            {
                ERROR("ReleaseWaiterWithoutBlocking failed on SynchData @ %p "
                      "[palErr = %u]\n", psdSynchDataItem, palErr);
            }
        }

        _ASSERT_MSG(bOriginatingNodeFound,
                    "Couldn't find originating node while unsignaling "
                    "rest of the wait all\n");
    }